

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_elements_pegout_script_from_bytes
              (uchar *genesis_blockhash,size_t genesis_blockhash_len,uchar *mainchain_script,
              size_t mainchain_script_len,uchar *sub_pubkey,size_t sub_pubkey_len,
              uchar *whitelistproof,size_t whitelistproof_len,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  uchar *puVar1;
  ulong uVar2;
  ulong uStack_48;
  int ret;
  size_t bytes_written;
  size_t sub_pubkey_len_local;
  uchar *sub_pubkey_local;
  size_t mainchain_script_len_local;
  uchar *mainchain_script_local;
  size_t genesis_blockhash_len_local;
  uchar *genesis_blockhash_local;
  
  uStack_48 = 1;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((((genesis_blockhash == (uchar *)0x0) || (genesis_blockhash_len != 0x20)) ||
        (mainchain_script == (uchar *)0x0)) ||
       ((mainchain_script_len == 0 || (sub_pubkey == (uchar *)0x0)))) ||
      ((sub_pubkey_len != 0x21 || ((whitelistproof == (uchar *)0x0 || (whitelistproof_len == 0))))))
     || ((flags != 0 || ((bytes_out == (uchar *)0x0 || (len == 0)))))) {
    genesis_blockhash_local._4_4_ = -2;
  }
  else {
    *bytes_out = 'j';
    if (written != (size_t *)0x0) {
      *written = *written + 1;
    }
    if (len == 0) {
      genesis_blockhash_local._4_4_ = 0;
    }
    else {
      puVar1 = bytes_out + 1;
      uVar2 = len - 1;
      bytes_written = sub_pubkey_len;
      sub_pubkey_len_local = (size_t)sub_pubkey;
      sub_pubkey_local = (uchar *)mainchain_script_len;
      mainchain_script_len_local = (size_t)mainchain_script;
      mainchain_script_local = (uchar *)genesis_blockhash_len;
      genesis_blockhash_len_local = (size_t)genesis_blockhash;
      genesis_blockhash_local._4_4_ =
           wally_script_push_from_bytes
                     (genesis_blockhash,0x20,0,puVar1,uVar2,&stack0xffffffffffffffb8);
      if (genesis_blockhash_local._4_4_ == 0) {
        if (written != (size_t *)0x0) {
          *written = uStack_48 + *written;
        }
        if (uVar2 < uStack_48) {
          genesis_blockhash_local._4_4_ = 0;
        }
        else {
          puVar1 = puVar1 + uStack_48;
          uVar2 = uVar2 - uStack_48;
          genesis_blockhash_local._4_4_ =
               wally_script_push_from_bytes
                         ((uchar *)mainchain_script_len_local,(size_t)sub_pubkey_local,0,puVar1,
                          uVar2,&stack0xffffffffffffffb8);
          if (genesis_blockhash_local._4_4_ == 0) {
            if (written != (size_t *)0x0) {
              *written = uStack_48 + *written;
            }
            if (uVar2 < uStack_48) {
              genesis_blockhash_local._4_4_ = 0;
            }
            else {
              puVar1 = puVar1 + uStack_48;
              uVar2 = uVar2 - uStack_48;
              genesis_blockhash_local._4_4_ =
                   wally_script_push_from_bytes
                             ((uchar *)sub_pubkey_len_local,bytes_written,0,puVar1,uVar2,
                              &stack0xffffffffffffffb8);
              if (genesis_blockhash_local._4_4_ == 0) {
                if (written != (size_t *)0x0) {
                  *written = uStack_48 + *written;
                }
                if (uVar2 < uStack_48) {
                  genesis_blockhash_local._4_4_ = 0;
                }
                else {
                  genesis_blockhash_local._4_4_ =
                       wally_script_push_from_bytes
                                 (whitelistproof,whitelistproof_len,0,puVar1 + uStack_48,
                                  uVar2 - uStack_48,&stack0xffffffffffffffb8);
                  if (genesis_blockhash_local._4_4_ == 0) {
                    if (written != (size_t *)0x0) {
                      *written = uStack_48 + *written;
                    }
                    genesis_blockhash_local._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return genesis_blockhash_local._4_4_;
}

Assistant:

int wally_elements_pegout_script_from_bytes(const unsigned char *genesis_blockhash,
                                            size_t genesis_blockhash_len,
                                            const unsigned char *mainchain_script,
                                            size_t mainchain_script_len,
                                            const unsigned char *sub_pubkey,
                                            size_t sub_pubkey_len,
                                            const unsigned char *whitelistproof,
                                            size_t whitelistproof_len,
                                            uint32_t flags,
                                            unsigned char *bytes_out,
                                            size_t len,
                                            size_t *written)
{
#define pegout_script_push(bytes, bytes_len) \
    if (len < bytes_written) \
        return WALLY_OK; \
    bytes_out += bytes_written; \
    len -= bytes_written; \
    if ((ret = wally_script_push_from_bytes(bytes, bytes_len, 0, bytes_out, len, &bytes_written)) != WALLY_OK) \
        return ret; \
    if (written) \
        *written += bytes_written;

    size_t bytes_written = 1; /* OP_RETURN */
    int ret;

    if (written)
        *written = 0;

    if (!genesis_blockhash || genesis_blockhash_len != SHA256_LEN ||
        !mainchain_script || !mainchain_script_len || !sub_pubkey || sub_pubkey_len != EC_PUBLIC_KEY_LEN ||
        !whitelistproof || !whitelistproof_len || flags || !bytes_out || !len)
        return WALLY_EINVAL;

    *bytes_out = OP_RETURN;
    if (written)
        *written += bytes_written;

    pegout_script_push(genesis_blockhash, genesis_blockhash_len);
    pegout_script_push(mainchain_script, mainchain_script_len);
    pegout_script_push(sub_pubkey, sub_pubkey_len);
    pegout_script_push(whitelistproof, whitelistproof_len);

    return WALLY_OK;

#undef pegout_script_push
}